

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall
QCborContainerPrivate::decodeValueFromCbor
          (QCborContainerPrivate *this,QCborStreamReader *reader,int remainingRecursionDepth)

{
  Type TVar1;
  uint uVar2;
  int iVar3;
  int in_EDX;
  QCborStreamReader *in_RSI;
  QCborStreamReader *in_RDI;
  long in_FS_OFFSET;
  Type t;
  QCborContainerPrivate *in_stack_00000060;
  QCborValue *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  ContainerDisposition in_stack_ffffffffffffff64;
  QCborContainerPrivate *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 local_20 [24];
  long local_8;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = QCborStreamReader::type((QCborStreamReader *)in_RSI);
  uVar2 = (uint)TVar1;
  if ((uVar2 != 0) && (uVar2 != 0x20)) {
    if ((uVar2 == 0x40) || (uVar2 == 0x60)) {
      decodeStringFromCbor(in_stack_00000060,(QCborStreamReader *)this);
      goto LAB_0046e640;
    }
    if ((uVar2 == 0x80) || (uVar2 == 0xa0)) {
      iVar3 = (TVar1 != Array | 4) << 5;
      createContainerFromCbor(in_RSI,in_EDX);
      makeValue((Type)((ulong)local_20 >> 0x20),CONCAT44(iVar3,in_stack_ffffffffffffff70),
                in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      append((QCborContainerPrivate *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
      ::QCborValue::~QCborValue
                ((QCborValue *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      goto LAB_0046e640;
    }
    if (uVar2 == 0xc0) {
      taggedValueFromCbor(in_RDI,iVar3);
      append((QCborContainerPrivate *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
      ::QCborValue::~QCborValue
                ((QCborValue *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      goto LAB_0046e640;
    }
    if ((uVar2 != 0xe0) && (2 < uVar2 - 0xf9)) goto LAB_0046e640;
  }
  decodeBasicValueFromCbor
            ((QCborStreamReader *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  QList<QtCbor::Element>::append
            ((QList<QtCbor::Element> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
             ,(rvalue_ref)in_stack_ffffffffffffff58);
LAB_0046e640:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborContainerPrivate::decodeValueFromCbor(QCborStreamReader &reader, int remainingRecursionDepth)
{
    QCborStreamReader::Type t = reader.type();
    switch (t) {
    case QCborStreamReader::UnsignedInteger:
    case QCborStreamReader::NegativeInteger:
    case QCborStreamReader::SimpleType:
    case QCborStreamReader::Float16:
    case QCborStreamReader::Float:
    case QCborStreamReader::Double:
        elements.append(decodeBasicValueFromCbor(reader));
        break;

    case QCborStreamReader::ByteArray:
    case QCborStreamReader::String:
        decodeStringFromCbor(reader);
        break;

    case QCborStreamReader::Array:
    case QCborStreamReader::Map:
        return append(makeValue(t == QCborStreamReader::Array ? QCborValue::Array : QCborValue::Map, -1,
                                createContainerFromCbor(reader, remainingRecursionDepth),
                                MoveContainer));

    case QCborStreamReader::Tag:
        return append(taggedValueFromCbor(reader, remainingRecursionDepth));

    case QCborStreamReader::Invalid:
        return;                 // probably a decode error
    }
}